

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QMainWindowLayout::takeAt(QMainWindowLayout *this,int index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  int *piVar5;
  int in_ESI;
  QMainWindowLayoutState *in_RDI;
  long in_FS_OFFSET;
  QRect QVar6;
  QLayoutItem *ret_1;
  QWidget *w;
  QLayoutItem *ret;
  int x;
  QList<int> *in_stack_ffffffffffffff88;
  parameter_type t;
  int *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  QMainWindowLayoutState *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  QMainWindowLayoutState *this_00;
  QLayoutItem *local_40;
  int *local_38;
  Data *local_30;
  QToolBarAreaLayout *in_stack_ffffffffffffffd8;
  QWidget **ppQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_40 = QMainWindowLayoutState::takeAt
                       (in_stack_ffffffffffffffa8,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                        in_stack_ffffffffffffff98);
  if (local_40 == (QLayoutItem *)0x0) {
    if ((*(long *)&in_RDI[2].toolBarAreaLayout.docks[1].dirty == 0) || (in_ESI != 0)) {
      local_40 = (QLayoutItem *)0x0;
    }
    else {
      local_40 = *(QLayoutItem **)&in_RDI[2].toolBarAreaLayout.docks[1].dirty;
      *(undefined8 *)&in_RDI[2].toolBarAreaLayout.docks[1].dirty = 0;
    }
  }
  else {
    iVar3 = (*local_40->_vptr_QLayoutItem[0xd])();
    ppQVar4 = (QWidget **)CONCAT44(extraout_var,iVar3);
    if ((ppQVar4 != (QWidget **)0x0) &&
       (QWidgetAnimator::abort((QWidgetAnimator *)(in_RDI[2].dockAreaLayout.corners + 2)),
       ppQVar4 == in_RDI[2].dockAreaLayout.docks[0].separatorWidgets.d.ptr)) {
      in_RDI[2].dockAreaLayout.docks[0].separatorWidgets.d.ptr = (QWidget **)0x0;
    }
    bVar2 = QMainWindowLayoutState::isValid((QMainWindowLayoutState *)0x5f887b);
    if (bVar2) {
      QMainWindowLayoutState::remove
                ((QMainWindowLayoutState *)&in_RDI[1].toolBarAreaLayout.docks[1].rect.x2,
                 (char *)local_40);
      QMainWindowLayoutState::remove
                ((QMainWindowLayoutState *)&(in_RDI->toolBarAreaLayout).docks[1].rect.x2,
                 (char *)local_40);
    }
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f88be);
    if ((!bVar2) && (piVar5 = QList<int>::constFirst((QList<int> *)in_RDI), *piVar5 == 0)) {
      QToolBarAreaLayout::currentGapIndex(in_stack_ffffffffffffffd8);
      QList<int>::operator=((QList<int> *)in_RDI,in_stack_ffffffffffffff88);
      t = (parameter_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      QList<int>::~QList((QList<int> *)0x5f891a);
      bVar2 = QList<int>::isEmpty((QList<int> *)0x5f892b);
      if (!bVar2) {
        QList<int>::prepend((QList<int> *)0x5f8942,t);
        QVar6 = QMainWindowLayoutState::itemRect
                          (this_00,(QList<int> *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
        local_38 = QVar6._0_8_;
        in_RDI[2].dockAreaLayout.docks[0].sep = local_38;
        local_30 = QVar6._8_8_;
        in_RDI[2].dockAreaLayout.docks[0].separatorWidgets.d.d = local_30;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

QLayoutItem *QMainWindowLayout::takeAt(int index)
{
    int x = 0;

    if (QLayoutItem *ret = layoutState.takeAt(index, &x)) {
        // the widget might in fact have been destroyed by now
        if (QWidget *w = ret->widget()) {
            widgetAnimator.abort(w);
            if (w == pluggingWidget)
                pluggingWidget = nullptr;
        }

        if (savedState.isValid() ) {
            //we need to remove the item also from the saved state to prevent crash
            savedState.remove(ret);
            //Also, the item may be contained several times as a gap item.
            layoutState.remove(ret);
        }

#if QT_CONFIG(toolbar)
        if (!currentGapPos.isEmpty() && currentGapPos.constFirst() == 0) {
            currentGapPos = layoutState.toolBarAreaLayout.currentGapIndex();
            if (!currentGapPos.isEmpty()) {
                currentGapPos.prepend(0);
                currentGapRect = layoutState.itemRect(currentGapPos);
            }
        }
#endif

        return ret;
    }

    if (statusbar && x++ == index) {
        QLayoutItem *ret = statusbar;
        statusbar = nullptr;
        return ret;
    }

    return nullptr;
}